

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayoutPrivate::setupLayoutData(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  uint uVar1;
  QGridBox *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  reference pQVar8;
  uint *puVar9;
  const_reference piVar10;
  qsizetype qVar11;
  QGridBox **ppQVar12;
  const_reference ppQVar13;
  QSize QVar14;
  reference pvVar15;
  const_reference pQVar16;
  QGridLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QGridBox *box_1;
  int c;
  int r;
  QGridBox *box;
  bool has_multi;
  int n;
  int i;
  QGridLayout *q;
  QVarLengthArray<QGridBox_*,_256LL> grid;
  QVarLengthArray<QGridLayoutSizeTriple,_256LL> sizes;
  Orientation in_stack_ffffffffffffde78;
  int in_stack_ffffffffffffde7c;
  undefined4 in_stack_ffffffffffffde80;
  byte in_stack_ffffffffffffde84;
  undefined1 in_stack_ffffffffffffde85;
  byte in_stack_ffffffffffffde86;
  undefined1 in_stack_ffffffffffffde87;
  QList<QLayoutStruct> *in_stack_ffffffffffffde88;
  int in_stack_ffffffffffffde90;
  int in_stack_ffffffffffffde94;
  int in_stack_ffffffffffffde98;
  int in_stack_ffffffffffffde9c;
  QLayout *in_stack_ffffffffffffdea0;
  int in_stack_ffffffffffffdec0;
  int in_stack_ffffffffffffdec4;
  QList<int> *in_stack_ffffffffffffdec8;
  int in_stack_ffffffffffffded0;
  QList<QLayoutStruct> *chain;
  QGridBox *in_stack_ffffffffffffdee8;
  int in_stack_ffffffffffffdef0;
  int in_stack_ffffffffffffdef4;
  QList<QLayoutStruct> *in_stack_ffffffffffffdef8;
  undefined4 in_stack_ffffffffffffdf00;
  int in_stack_ffffffffffffdf04;
  QGridBox *in_stack_ffffffffffffdf08;
  undefined4 in_stack_ffffffffffffdf10;
  int in_stack_ffffffffffffdf14;
  int local_20c4;
  int local_20ac;
  int local_2088;
  int local_2084;
  int local_206c;
  QVLABase<QGridBox_*> local_2038 [86];
  undefined1 local_1820 [6168];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (((byte)in_RDI->field_0x194 >> 2 & 1) != 0) {
    in_RDI->field_0x194 = in_RDI->field_0x194 & 0xf7;
    for (local_206c = 0; local_206c < in_RDI->rr; local_206c = local_206c + 1) {
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde87,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde85,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      puVar9 = (uint *)QList<int>::at((QList<int> *)
                                      CONCAT17(in_stack_ffffffffffffde87,
                                               CONCAT16(in_stack_ffffffffffffde86,
                                                        CONCAT15(in_stack_ffffffffffffde85,
                                                                 CONCAT14(in_stack_ffffffffffffde84,
                                                                          in_stack_ffffffffffffde80)
                                                                ))),
                                      CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78))
      ;
      uVar1 = *puVar9;
      QList<int>::at((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffde87,
                              CONCAT16(in_stack_ffffffffffffde86,
                                       CONCAT15(in_stack_ffffffffffffde85,
                                                CONCAT14(in_stack_ffffffffffffde84,
                                                         in_stack_ffffffffffffde80)))),
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      QLayoutStruct::init(pQVar8,(EVP_PKEY_CTX *)(ulong)uVar1);
      piVar10 = QList<int>::at((QList<int> *)
                               CONCAT17(in_stack_ffffffffffffde87,
                                        CONCAT16(in_stack_ffffffffffffde86,
                                                 CONCAT15(in_stack_ffffffffffffde85,
                                                          CONCAT14(in_stack_ffffffffffffde84,
                                                                   in_stack_ffffffffffffde80)))),
                               CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      if (*piVar10 == 0) {
        piVar10 = QList<int>::at((QList<int> *)
                                 CONCAT17(in_stack_ffffffffffffde87,
                                          CONCAT16(in_stack_ffffffffffffde86,
                                                   CONCAT15(in_stack_ffffffffffffde85,
                                                            CONCAT14(in_stack_ffffffffffffde84,
                                                                     in_stack_ffffffffffffde80)))),
                                 CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
        local_20ac = *piVar10;
      }
      else {
        local_20ac = 0x7ffff;
      }
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde87,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde85,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pQVar8->maximumSize = local_20ac;
    }
    for (local_206c = 0; local_206c < in_RDI->cc; local_206c = local_206c + 1) {
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde87,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde85,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      puVar9 = (uint *)QList<int>::at((QList<int> *)
                                      CONCAT17(in_stack_ffffffffffffde87,
                                               CONCAT16(in_stack_ffffffffffffde86,
                                                        CONCAT15(in_stack_ffffffffffffde85,
                                                                 CONCAT14(in_stack_ffffffffffffde84,
                                                                          in_stack_ffffffffffffde80)
                                                                ))),
                                      CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78))
      ;
      uVar1 = *puVar9;
      QList<int>::at((QList<int> *)
                     CONCAT17(in_stack_ffffffffffffde87,
                              CONCAT16(in_stack_ffffffffffffde86,
                                       CONCAT15(in_stack_ffffffffffffde85,
                                                CONCAT14(in_stack_ffffffffffffde84,
                                                         in_stack_ffffffffffffde80)))),
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      QLayoutStruct::init(pQVar8,(EVP_PKEY_CTX *)(ulong)uVar1);
      piVar10 = QList<int>::at((QList<int> *)
                               CONCAT17(in_stack_ffffffffffffde87,
                                        CONCAT16(in_stack_ffffffffffffde86,
                                                 CONCAT15(in_stack_ffffffffffffde85,
                                                          CONCAT14(in_stack_ffffffffffffde84,
                                                                   in_stack_ffffffffffffde80)))),
                               CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      if (*piVar10 == 0) {
        piVar10 = QList<int>::at((QList<int> *)
                                 CONCAT17(in_stack_ffffffffffffde87,
                                          CONCAT16(in_stack_ffffffffffffde86,
                                                   CONCAT15(in_stack_ffffffffffffde85,
                                                            CONCAT14(in_stack_ffffffffffffde84,
                                                                     in_stack_ffffffffffffde80)))),
                                 CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
        local_20c4 = *piVar10;
      }
      else {
        local_20c4 = 0x7ffff;
      }
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde87,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde85,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pQVar8->maximumSize = local_20c4;
    }
    qVar11 = QList<QGridBox_*>::size(&in_RDI->things);
    memset(local_1820,0xaa,0x1818);
    QVarLengthArray<QGridLayoutSizeTriple,_256LL>::QVarLengthArray
              ((QVarLengthArray<QGridLayoutSizeTriple,_256LL> *)
               CONCAT17(in_stack_ffffffffffffde87,
                        CONCAT16(in_stack_ffffffffffffde86,
                                 CONCAT15(in_stack_ffffffffffffde85,
                                          CONCAT14(in_stack_ffffffffffffde84,
                                                   in_stack_ffffffffffffde80)))),
               CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
    bVar3 = false;
    memset(local_2038,0xaa,0x818);
    QVarLengthArray<QGridBox_*,_256LL>::QVarLengthArray
              ((QVarLengthArray<QGridBox_*,_256LL> *)
               CONCAT17(in_stack_ffffffffffffde87,
                        CONCAT16(in_stack_ffffffffffffde86,
                                 CONCAT15(in_stack_ffffffffffffde85,
                                          CONCAT14(in_stack_ffffffffffffde84,
                                                   in_stack_ffffffffffffde80)))),
               CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
    ppQVar12 = QVLABase<QGridBox_*>::data(local_2038);
    memset(ppQVar12,0,(long)(in_RDI->rr * in_RDI->cc) << 3);
    for (local_206c = 0; local_206c < (int)qVar11; local_206c = local_206c + 1) {
      ppQVar13 = QList<QGridBox_*>::at
                           ((QList<QGridBox_*> *)
                            CONCAT17(in_stack_ffffffffffffde87,
                                     CONCAT16(in_stack_ffffffffffffde86,
                                              CONCAT15(in_stack_ffffffffffffde85,
                                                       CONCAT14(in_stack_ffffffffffffde84,
                                                                in_stack_ffffffffffffde80)))),
                            CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pQVar2 = *ppQVar13;
      QVar14 = QGridBox::minimumSize
                         ((QGridBox *)CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78))
      ;
      pvVar15 = QVLABase<QGridLayoutSizeTriple>::operator[]
                          ((QVLABase<QGridLayoutSizeTriple> *)
                           CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331593);
      pvVar15->minS = QVar14;
      QVar14 = QGridBox::sizeHint((QGridBox *)
                                  CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pvVar15 = QVLABase<QGridLayoutSizeTriple>::operator[]
                          ((QVLABase<QGridLayoutSizeTriple> *)
                           CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x3315c8);
      pvVar15->hint = QVar14;
      QVar14 = QGridBox::maximumSize
                         ((QGridBox *)CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78))
      ;
      pvVar15 = QVLABase<QGridLayoutSizeTriple>::operator[]
                          ((QVLABase<QGridLayoutSizeTriple> *)
                           CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x3315fe);
      pvVar15->maxS = QVar14;
      bVar4 = QGridBox::hasHeightForWidth((QGridBox *)0x331617);
      if (bVar4) {
        in_RDI->field_0x194 = in_RDI->field_0x194 & 0xf7 | 8;
      }
      iVar6 = pQVar2->row;
      iVar5 = QGridBox::toRow(pQVar2,in_RDI->rr);
      if (iVar6 == iVar5) {
        QVLABase<QGridLayoutSizeTriple>::operator[]
                  ((QVLABase<QGridLayoutSizeTriple> *)
                   CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331696);
        addData((QGridLayoutPrivate *)CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
                in_stack_ffffffffffffdf08,
                (QGridLayoutSizeTriple *)
                CONCAT44(in_stack_ffffffffffffdf04,in_stack_ffffffffffffdf00),
                SUB81((ulong)in_stack_ffffffffffffdef8 >> 0x38,0),
                SUB81((ulong)in_stack_ffffffffffffdef8 >> 0x30,0));
      }
      else {
        QGridBox::toRow(pQVar2,in_RDI->rr);
        initEmptyMultiBox((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_ffffffffffffde94,in_stack_ffffffffffffde90),
                          (int)((ulong)in_stack_ffffffffffffde88 >> 0x20),
                          (int)in_stack_ffffffffffffde88);
        bVar3 = true;
      }
      in_stack_ffffffffffffdf14 = pQVar2->col;
      iVar6 = QGridBox::toCol(pQVar2,in_RDI->cc);
      if (in_stack_ffffffffffffdf14 == iVar6) {
        in_stack_ffffffffffffdf08 = pQVar2;
        QVLABase<QGridLayoutSizeTriple>::operator[]
                  ((QVLABase<QGridLayoutSizeTriple> *)
                   CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331774);
        addData((QGridLayoutPrivate *)CONCAT44(in_stack_ffffffffffffdf14,in_stack_ffffffffffffdf10),
                in_stack_ffffffffffffdf08,
                (QGridLayoutSizeTriple *)
                CONCAT44(in_stack_ffffffffffffdf04,in_stack_ffffffffffffdf00),
                SUB81((ulong)in_stack_ffffffffffffdef8 >> 0x38,0),
                SUB81((ulong)in_stack_ffffffffffffdef8 >> 0x30,0));
      }
      else {
        in_stack_ffffffffffffdef8 = &in_RDI->colData;
        in_stack_ffffffffffffdf04 = pQVar2->col;
        QGridBox::toCol(pQVar2,in_RDI->cc);
        initEmptyMultiBox((QList<QLayoutStruct> *)
                          CONCAT44(in_stack_ffffffffffffde94,in_stack_ffffffffffffde90),
                          (int)((ulong)in_stack_ffffffffffffde88 >> 0x20),
                          (int)in_stack_ffffffffffffde88);
        bVar3 = true;
      }
      local_2084 = pQVar2->row;
      while (in_stack_ffffffffffffdef4 = local_2084, iVar6 = QGridBox::toRow(pQVar2,in_RDI->rr),
            in_stack_ffffffffffffdef4 <= iVar6) {
        local_2088 = pQVar2->col;
        while (in_stack_ffffffffffffdef0 = local_2088, iVar6 = QGridBox::toCol(pQVar2,in_RDI->cc),
              in_stack_ffffffffffffdef0 <= iVar6) {
          in_stack_ffffffffffffdee8 = pQVar2;
          QVLABase<QGridBox_*>::data(local_2038);
          ppQVar12 = gridAt((QGridBox **)
                            CONCAT17(in_stack_ffffffffffffde87,
                                     CONCAT16(in_stack_ffffffffffffde86,
                                              CONCAT15(in_stack_ffffffffffffde85,
                                                       CONCAT14(in_stack_ffffffffffffde84,
                                                                in_stack_ffffffffffffde80)))),
                            (int)((ulong)in_stack_ffffffffffffde88 >> 0x20),
                            (int)in_stack_ffffffffffffde88,in_stack_ffffffffffffde7c,
                            in_stack_ffffffffffffde78);
          *ppQVar12 = in_stack_ffffffffffffdee8;
          local_2088 = local_2088 + 1;
        }
        local_2084 = local_2084 + 1;
      }
    }
    chain = &in_RDI->colData;
    QVLABase<QGridBox_*>::data(local_2038);
    setupSpacings((QGridLayoutPrivate *)
                  CONCAT44(in_stack_ffffffffffffdf04,in_stack_ffffffffffffdf00),
                  in_stack_ffffffffffffdef8,
                  (QGridBox **)CONCAT44(in_stack_ffffffffffffdef4,in_stack_ffffffffffffdef0),
                  (int)((ulong)in_stack_ffffffffffffdee8 >> 0x20),
                  (Orientation)in_stack_ffffffffffffdee8);
    QVLABase<QGridBox_*>::data(local_2038);
    setupSpacings((QGridLayoutPrivate *)
                  CONCAT44(in_stack_ffffffffffffdf04,in_stack_ffffffffffffdf00),
                  in_stack_ffffffffffffdef8,
                  (QGridBox **)CONCAT44(in_stack_ffffffffffffdef4,in_stack_ffffffffffffdef0),
                  (int)((ulong)in_stack_ffffffffffffdee8 >> 0x20),
                  (Orientation)in_stack_ffffffffffffdee8);
    if (bVar3) {
      for (local_206c = 0; local_206c < (int)qVar11; local_206c = local_206c + 1) {
        ppQVar13 = QList<QGridBox_*>::at
                             ((QList<QGridBox_*> *)
                              CONCAT17(in_stack_ffffffffffffde87,
                                       CONCAT16(in_stack_ffffffffffffde86,
                                                CONCAT15(in_stack_ffffffffffffde85,
                                                         CONCAT14(in_stack_ffffffffffffde84,
                                                                  in_stack_ffffffffffffde80)))),
                              CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
        pQVar2 = *ppQVar13;
        iVar6 = pQVar2->row;
        iVar5 = QGridBox::toRow(pQVar2,in_RDI->rr);
        if (iVar6 != iVar5) {
          QGridBox::toRow(pQVar2,in_RDI->rr);
          QVLABase<QGridLayoutSizeTriple>::operator[]
                    ((QVLABase<QGridLayoutSizeTriple> *)
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331a72);
          in_stack_ffffffffffffdec0 = QSize::height((QSize *)0x331a7a);
          QVLABase<QGridLayoutSizeTriple>::operator[]
                    ((QVLABase<QGridLayoutSizeTriple> *)
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331a93);
          in_stack_ffffffffffffdec4 = QSize::height((QSize *)0x331a9f);
          in_stack_ffffffffffffdec8 = &in_RDI->rStretch;
          in_stack_ffffffffffffde78 =
               QGridBox::vStretch((QGridBox *)
                                  CONCAT17(in_stack_ffffffffffffde87,
                                           CONCAT16(in_stack_ffffffffffffde86,
                                                    CONCAT15(in_stack_ffffffffffffde85,
                                                             CONCAT14(in_stack_ffffffffffffde84,
                                                                      in_stack_ffffffffffffde80)))))
          ;
          distributeMultiBox(chain,iVar6,in_stack_ffffffffffffded0,
                             (int)((ulong)in_stack_ffffffffffffdec8 >> 0x20),
                             (int)in_stack_ffffffffffffdec8,
                             (QList<int> *)
                             CONCAT44(in_stack_ffffffffffffdec4,in_stack_ffffffffffffdec0),
                             in_stack_ffffffffffffdef0);
        }
        iVar5 = pQVar2->col;
        iVar7 = QGridBox::toCol(pQVar2,in_RDI->cc);
        if (iVar5 != iVar7) {
          in_stack_ffffffffffffde88 = &in_RDI->colData;
          in_stack_ffffffffffffde90 = pQVar2->col;
          in_stack_ffffffffffffde94 = QGridBox::toCol(pQVar2,in_RDI->cc);
          QVLABase<QGridLayoutSizeTriple>::operator[]
                    ((QVLABase<QGridLayoutSizeTriple> *)
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331b72);
          in_stack_ffffffffffffde98 = QSize::width((QSize *)0x331b7a);
          QVLABase<QGridLayoutSizeTriple>::operator[]
                    ((QVLABase<QGridLayoutSizeTriple> *)
                     CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78),0x331b93);
          in_stack_ffffffffffffde9c = QSize::width((QSize *)0x331b9f);
          in_stack_ffffffffffffdea0 = (QLayout *)&in_RDI->cStretch;
          in_stack_ffffffffffffde78 =
               QGridBox::hStretch((QGridBox *)
                                  CONCAT17(in_stack_ffffffffffffde87,
                                           CONCAT16(in_stack_ffffffffffffde86,
                                                    CONCAT15(in_stack_ffffffffffffde85,
                                                             CONCAT14(in_stack_ffffffffffffde84,
                                                                      in_stack_ffffffffffffde80)))))
          ;
          distributeMultiBox(chain,iVar6,in_stack_ffffffffffffded0,
                             (int)((ulong)in_stack_ffffffffffffdec8 >> 0x20),
                             (int)in_stack_ffffffffffffdec8,
                             (QList<int> *)
                             CONCAT44(in_stack_ffffffffffffdec4,in_stack_ffffffffffffdec0),
                             in_stack_ffffffffffffdef0);
        }
      }
    }
    for (local_206c = 0; local_206c < in_RDI->rr; local_206c = local_206c + 1) {
      pQVar16 = QList<QLayoutStruct>::at
                          ((QList<QLayoutStruct> *)
                           CONCAT17(in_stack_ffffffffffffde87,
                                    CONCAT16(in_stack_ffffffffffffde86,
                                             CONCAT15(in_stack_ffffffffffffde85,
                                                      CONCAT14(in_stack_ffffffffffffde84,
                                                               in_stack_ffffffffffffde80)))),
                           CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      bVar3 = true;
      if ((pQVar16->expansive & 1U) == 0) {
        pQVar16 = QList<QLayoutStruct>::at
                            ((QList<QLayoutStruct> *)
                             CONCAT17(1,CONCAT16(in_stack_ffffffffffffde86,
                                                 CONCAT15(in_stack_ffffffffffffde85,
                                                          CONCAT14(in_stack_ffffffffffffde84,
                                                                   in_stack_ffffffffffffde80)))),
                             CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
        bVar3 = 0 < pQVar16->stretch;
      }
      in_stack_ffffffffffffde86 = bVar3;
      in_stack_ffffffffffffde87 = in_stack_ffffffffffffde86;
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde86,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde85,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pQVar8->expansive = (bool)(in_stack_ffffffffffffde86 & 1);
    }
    for (local_206c = 0; local_206c < in_RDI->cc; local_206c = local_206c + 1) {
      pQVar16 = QList<QLayoutStruct>::at
                          ((QList<QLayoutStruct> *)
                           CONCAT17(in_stack_ffffffffffffde87,
                                    CONCAT16(in_stack_ffffffffffffde86,
                                             CONCAT15(in_stack_ffffffffffffde85,
                                                      CONCAT14(in_stack_ffffffffffffde84,
                                                               in_stack_ffffffffffffde80)))),
                           CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      bVar3 = true;
      if ((pQVar16->expansive & 1U) == 0) {
        pQVar16 = QList<QLayoutStruct>::at
                            ((QList<QLayoutStruct> *)
                             CONCAT17(in_stack_ffffffffffffde87,
                                      CONCAT16(in_stack_ffffffffffffde86,
                                               CONCAT15(1,CONCAT14(in_stack_ffffffffffffde84,
                                                                   in_stack_ffffffffffffde80)))),
                             CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
        bVar3 = 0 < pQVar16->stretch;
      }
      in_stack_ffffffffffffde84 = bVar3;
      in_stack_ffffffffffffde85 = in_stack_ffffffffffffde84;
      pQVar8 = QList<QLayoutStruct>::operator[]
                         ((QList<QLayoutStruct> *)
                          CONCAT17(in_stack_ffffffffffffde87,
                                   CONCAT16(in_stack_ffffffffffffde86,
                                            CONCAT15(in_stack_ffffffffffffde84,
                                                     CONCAT14(in_stack_ffffffffffffde84,
                                                              in_stack_ffffffffffffde80)))),
                          CONCAT44(in_stack_ffffffffffffde7c,in_stack_ffffffffffffde78));
      pQVar8->expansive = (bool)(in_stack_ffffffffffffde84 & 1);
    }
    QLayout::getContentsMargins
              (in_stack_ffffffffffffdea0,
               (int *)CONCAT44(in_stack_ffffffffffffde9c,in_stack_ffffffffffffde98),
               (int *)CONCAT44(in_stack_ffffffffffffde94,in_stack_ffffffffffffde90),
               (int *)in_stack_ffffffffffffde88,
               (int *)CONCAT17(in_stack_ffffffffffffde87,
                               CONCAT16(in_stack_ffffffffffffde86,
                                        CONCAT15(in_stack_ffffffffffffde85,
                                                 CONCAT14(in_stack_ffffffffffffde84,
                                                          in_stack_ffffffffffffde80)))));
    in_RDI->field_0x194 = in_RDI->field_0x194 & 0xfb;
    QVarLengthArray<QGridBox_*,_256LL>::~QVarLengthArray
              ((QVarLengthArray<QGridBox_*,_256LL> *)
               CONCAT17(in_stack_ffffffffffffde87,
                        CONCAT16(in_stack_ffffffffffffde86,
                                 CONCAT15(in_stack_ffffffffffffde85,
                                          CONCAT14(in_stack_ffffffffffffde84,
                                                   in_stack_ffffffffffffde80)))));
    QVarLengthArray<QGridLayoutSizeTriple,_256LL>::~QVarLengthArray
              ((QVarLengthArray<QGridLayoutSizeTriple,_256LL> *)
               CONCAT44(in_stack_ffffffffffffde94,in_stack_ffffffffffffde90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupLayoutData(int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);

#ifndef QT_LAYOUT_DISABLE_CACHING
    if (!needRecalc)
        return;
#endif
    has_hfw = false;
    int i;

    for (i = 0; i < rr; i++) {
        rowData[i].init(rStretch.at(i), rMinHeights.at(i));
        rowData[i].maximumSize = rStretch.at(i) ? QLAYOUTSIZE_MAX : rMinHeights.at(i);
    }
    for (i = 0; i < cc; i++) {
        colData[i].init(cStretch.at(i), cMinWidths.at(i));
        colData[i].maximumSize = cStretch.at(i) ? QLAYOUTSIZE_MAX : cMinWidths.at(i);
    }

    int n = things.size();
    QVarLengthArray<QGridLayoutSizeTriple> sizes(n);

    bool has_multi = false;

    /*
        Grid of items. We use it to determine which items are
        adjacent to which and compute the spacings correctly.
    */
    QVarLengthArray<QGridBox *> grid(rr * cc);
    memset(grid.data(), 0, rr * cc * sizeof(QGridBox *));

    /*
        Initialize 'sizes' and 'grid' data structures, and insert
        non-spanning items to our row and column data structures.
    */
    for (i = 0; i < n; ++i) {
        QGridBox * const box = things.at(i);
        sizes[i].minS = box->minimumSize();
        sizes[i].hint = box->sizeHint();
        sizes[i].maxS = box->maximumSize();

        if (box->hasHeightForWidth())
            has_hfw = true;

        if (box->row == box->toRow(rr)) {
            addData(box, sizes[i], true, false);
        } else {
            initEmptyMultiBox(rowData, box->row, box->toRow(rr));
            has_multi = true;
        }

        if (box->col == box->toCol(cc)) {
            addData(box, sizes[i], false, true);
        } else {
            initEmptyMultiBox(colData, box->col, box->toCol(cc));
            has_multi = true;
        }

        for (int r = box->row; r <= box->toRow(rr); ++r) {
            for (int c = box->col; c <= box->toCol(cc); ++c) {
                gridAt(grid.data(), r, c, cc) = box;
            }
        }
    }

    setupSpacings(colData, grid.data(), hSpacing, Qt::Horizontal);
    setupSpacings(rowData, grid.data(), vSpacing, Qt::Vertical);

    /*
        Insert multicell items to our row and column data structures.
        This must be done after the non-spanning items to obtain a
        better distribution in distributeMultiBox().
    */
    if (has_multi) {
        for (i = 0; i < n; ++i) {
            QGridBox * const box = things.at(i);

            if (box->row != box->toRow(rr))
                distributeMultiBox(rowData, box->row, box->toRow(rr), sizes[i].minS.height(),
                                   sizes[i].hint.height(), rStretch, box->vStretch());
            if (box->col != box->toCol(cc))
                distributeMultiBox(colData, box->col, box->toCol(cc), sizes[i].minS.width(),
                                   sizes[i].hint.width(), cStretch, box->hStretch());
        }
    }

    for (i = 0; i < rr; i++)
        rowData[i].expansive = rowData.at(i).expansive || rowData.at(i).stretch > 0;
    for (i = 0; i < cc; i++)
        colData[i].expansive = colData.at(i).expansive || colData.at(i).stretch > 0;

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    needRecalc = false;
}